

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ConfigDeclarationSyntax::getChild(ConfigDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff28;
  Info *in_stack_ffffffffffffff30;
  nullptr_t in_stack_ffffffffffffff38;
  ConstTokenOrSyntax *in_stack_ffffffffffffff40;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff30;
    token._0_8_ = in_stack_ffffffffffffff28;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c060e,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff30;
    token_00._0_8_ = in_stack_ffffffffffffff28;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c064a,token_00);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff30;
    token_01._0_8_ = in_stack_ffffffffffffff28;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c0686,token_01);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    break;
  case 5:
    token_02.info = in_stack_ffffffffffffff30;
    token_02._0_8_ = in_stack_ffffffffffffff28;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c0708,token_02);
    break;
  case 6:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    break;
  case 7:
    token_03.info = in_stack_ffffffffffffff30;
    token_03._0_8_ = in_stack_ffffffffffffff28;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c0784,token_03);
    break;
  case 8:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x110),in_stack_ffffffffffffff28);
    break;
  case 9:
    token_04.info = in_stack_ffffffffffffff30;
    token_04._0_8_ = in_stack_ffffffffffffff28;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6c07f7,token_04);
    break;
  case 10:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ConfigDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return config;
        case 2: return name;
        case 3: return semi1;
        case 4: return &localparams;
        case 5: return design;
        case 6: return &topCells;
        case 7: return semi2;
        case 8: return &rules;
        case 9: return endconfig;
        case 10: return blockName;
        default: return nullptr;
    }
}